

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::DefaultMinimize::integrateBound(DefaultMinimize *this,Solver *s)

{
  undefined1 *puVar1;
  size_type sVar2;
  size_type sVar3;
  uint uVar4;
  SharedData *pSVar5;
  wsum_t *pwVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint32 uVar10;
  uint32 uVar11;
  ulong uVar12;
  uint32 x;
  WeightLiteral min;
  
  bVar8 = SharedMinimizeData::optimize((this->super_MinimizeConstraint).shared_);
  if (bVar8) {
    bVar8 = true;
    if (*(uint *)&(this->step_).field_0x4 < 0x40000000) {
      bVar8 = ((this->super_MinimizeConstraint).shared_)->mode_ == enumOpt;
    }
  }
  else {
    bVar8 = false;
  }
  bVar9 = MinimizeConstraint::prepare(&this->super_MinimizeConstraint,s,bVar8);
  if (bVar9) {
    if ((bVar8 != false) &&
       (*(uint *)((long)(s->assign_).assign_.ebo_.buf +
                 (ulong)((this->super_MinimizeConstraint).tag_.rep_ & 0xfffffffc)) < 0x10)) {
      puVar1 = &(this->step_).field_0x7;
      *puVar1 = *puVar1 & 0x3f;
      stepInit(this,0);
    }
    if ((*this->bounds_ == 0x7fffffffffffffff) ||
       ((pSVar5 = (this->super_MinimizeConstraint).shared_, pSVar5->mode_ != enumerate &&
        ((pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar5->optGen_)))) {
      sVar2 = (((this->super_MinimizeConstraint).shared_)->weights).ebo_.size;
      min.second = sVar2 - 1;
      if (sVar2 == 0) {
        min.second = 0;
      }
      min.first.rep_ = 0;
      while ((s->conflict_).ebo_.size == 0) {
        pSVar5 = (this->super_MinimizeConstraint).shared_;
        if (pSVar5->mode_ == enumerate) {
          bVar8 = false;
        }
        else {
          bVar8 = (pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar5->optGen_;
        }
        bVar8 = updateBounds(this,bVar8);
        if (!bVar8) break;
        x = 0;
        sVar3 = (s->levels_).super_type.ebo_.size;
        bVar8 = SharedMinimizeData::imp
                          ((this->super_MinimizeConstraint).shared_,this->bounds_ + this->size_,&min
                           ,this->bounds_,&this->actLev_);
        if (bVar8) {
          uVar10 = computeImplicationSet(this,s,&min,&x);
          if ((s->levels_).root < uVar10) goto LAB_0014c274;
        }
        else {
          uVar10 = sVar3 + 1;
LAB_0014c274:
          while (((s->conflict_).ebo_.size == 0 || (bVar8 = Solver::resolveConflict(s), bVar8))) {
            uVar11 = Solver::undoUntil(s,uVar10 - 1,1);
            if (uVar10 - 1 < uVar11) {
              Solver::backtrack(s);
            }
            else {
              bVar8 = propagateImpl(this,s,propagate_new_opt);
              if (bVar8) {
                return true;
              }
            }
          }
        }
        pSVar5 = (this->super_MinimizeConstraint).shared_;
        if ((pSVar5->mode_ == enumerate) ||
           ((pSVar5->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar5->optGen_)) break;
        uVar4 = *(uint *)&(this->step_).field_0x4;
        if ((ulong)uVar4 < 0x40000000) {
          *(uint *)&(this->step_).field_0x4 = uVar4 + 1 & 0x3fffffff;
        }
        else {
          pwVar6 = this->bounds_;
          uVar12 = (ulong)uVar4 & 0x3fffffff;
          lVar7 = pwVar6[uVar12];
          pwVar6[uVar12] = lVar7 + 1;
          pwVar6[(ulong)(this->size_ * 3) + ((ulong)*(uint *)&(this->step_).field_0x4 & 0x3fffffff)]
               = lVar7 + 1;
        }
      }
      bVar8 = false;
      relaxBound(this,false);
      if ((s->conflict_).ebo_.size == 0) {
        bVar8 = false;
        Solver::undoUntil(s,0);
        Solver::setStopConflict(s);
      }
    }
    else {
      bVar8 = (s->conflict_).ebo_.size == 0;
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool DefaultMinimize::integrateBound(Solver& s) {
	bool useTag = shared_->optimize() && (step_.type != 0 || shared_->mode() == MinimizeMode_t::enumOpt);
	if (!prepare(s, useTag)) { return false; }
	if (useTag && s.level(tag_.var()) == 0) {
		step_.type = 0;
		stepInit(0);
	}
	if ((active() && !shared_->checkNext())) { return !s.hasConflict(); }
	WeightLiteral min(lit_true(), shared_->weights.empty() ? uint32(0) : (uint32)shared_->weights.size()-1);
	while (!s.hasConflict() && updateBounds(shared_->checkNext())) {
		uint32 x = 0;
		uint32 dl= s.decisionLevel() + 1;
		if (!STRATEGY(imp(sum(), min, opt(), actLev_)) || (dl = computeImplicationSet(s, min, x)) > s.rootLevel()) {
			for (--dl; !s.hasConflict() || s.resolveConflict(); ) {
				if      (s.undoUntil(dl, Solver::undo_pop_bt_level) > dl){ s.backtrack(); }
				else if (propagateImpl(s, propagate_new_opt))            { return true;   }
			}
		}
		if (!shared_->checkNext()) {
			break;
		}
		if (!step_.type) { ++step_.lev; }
		else             { stepLow() = ++opt()[step_.lev]; }
	}
	relaxBound(false);
	if (!s.hasConflict()) {
		s.undoUntil(0);
		s.setStopConflict();
	}
	return false;
}